

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_value.hpp
# Opt level: O2

void __thiscall
chaiscript::Boxed_Value::Boxed_Value<chaiscript::dispatch::Dynamic_Object,void>
          (Boxed_Value *this,Dynamic_Object *t,bool t_return_value)

{
  Dynamic_Object local_70;
  
  dispatch::Dynamic_Object::Dynamic_Object(&local_70,t);
  Object_Data::get<chaiscript::dispatch::Dynamic_Object>((Dynamic_Object *)this,SUB81(&local_70,0));
  dispatch::Dynamic_Object::~Dynamic_Object(&local_70);
  return;
}

Assistant:

explicit Boxed_Value(T &&t, bool t_return_value = false)
        : m_data(Object_Data::get(std::forward<T>(t), t_return_value)) {
    }